

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O2

void Write(string *output,vector<TCacheReq,_std::allocator<TCacheReq>_> *reqs)

{
  pointer pTVar1;
  ostream *poVar2;
  TCacheReq *req;
  pointer pTVar3;
  ofstream out;
  
  std::ofstream::ofstream(&out,(string *)output,_S_out);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
  std::endl<char,std::char_traits<char>>(poVar2);
  pTVar1 = (reqs->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar3 = (reqs->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void Write(const std::string& output, const std::vector<TCacheReq>& reqs) {
    std::ofstream out(output);
    out << reqs.size() << std::endl;
    for (const auto& req : reqs) {
        out << req.ServerId << " " << req.VideoId << std::endl;
    }
    out.close();
}